

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStructMatrix.cpp
# Opt level: O0

void __thiscall
TPZStructMatrix::SetMaterialIds
          (TPZStructMatrix *this,set<int,_std::less<int>,_std::allocator<int>_> *materialids)

{
  bool bVar1;
  ostream *this_00;
  TPZCompEl **ppTVar2;
  TPZStructMatrix *in_RSI;
  long in_RDI;
  TPZStructMatrix *str;
  TPZAutoPointer<TPZLinearAnalysis> analysis;
  TPZSubCompMesh *subcmesh;
  TPZCompEl *cel;
  int64_t nel;
  TPZAdmChunkVector<TPZCompEl_*,_10> *elvec;
  int64_t iel;
  size_t in_stack_00000368;
  char *in_stack_00000370;
  TPZSubCompMesh *in_stack_ffffffffffffff48;
  ostream *in_stack_ffffffffffffff50;
  TPZAnalysis *in_stack_ffffffffffffff58;
  ostream *in_stack_ffffffffffffff68;
  TPZChunkVector<TPZCompEl_*,_10> *in_stack_ffffffffffffff70;
  long local_80;
  TPZAutoPointer<TPZStructMatrix> local_60;
  TPZAnalysis *local_58;
  long local_38;
  TPZCompEl *local_30;
  TPZCompEl ***local_28;
  TPZAdmChunkVector<TPZCompEl_*,_10> *local_20;
  set<int,_std::less<int>,_std::allocator<int>_> *materialids_00;
  
  std::set<int,_std::less<int>,_std::allocator<int>_>::operator=
            ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffff50,
             (set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffff48);
  if (*(long *)(in_RDI + 8) == 0) {
    this_00 = std::operator<<((ostream *)&std::cout,"SetMaterialIds called without mesh");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  else {
    local_20 = TPZCompMesh::ElementVec(*(TPZCompMesh **)(in_RDI + 8));
    local_28 = (TPZCompEl ***)
               TPZChunkVector<TPZCompEl_*,_10>::NElements
                         (&local_20->super_TPZChunkVector<TPZCompEl_*,_10>);
    for (materialids_00 = (set<int,_std::less<int>,_std::allocator<int>_> *)0x0;
        (long)materialids_00 < (long)local_28;
        materialids_00 =
             (set<int,_std::less<int>,_std::allocator<int>_> *)
             &(materialids_00->_M_t)._M_impl.field_0x1) {
      ppTVar2 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (in_stack_ffffffffffffff70,(int64_t)in_stack_ffffffffffffff68);
      local_30 = *ppTVar2;
      if (local_30 != (TPZCompEl *)0x0) {
        if (local_30 == (TPZCompEl *)0x0) {
          local_80 = 0;
        }
        else {
          local_80 = __dynamic_cast(local_30,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,0x918);
        }
        local_38 = local_80;
        if (local_80 != 0) {
          in_stack_ffffffffffffff70 = (TPZChunkVector<TPZCompEl_*,_10> *)&stack0xffffffffffffffc0;
          TPZSubCompMesh::Analysis(in_stack_ffffffffffffff48);
          bVar1 = ::TPZAutoPointer::operator_cast_to_bool
                            ((TPZAutoPointer *)in_stack_ffffffffffffff70);
          if (!bVar1) {
            in_stack_ffffffffffffff68 =
                 std::operator<<((ostream *)&std::cout,
                                 "SetMaterialIds called for substructure without analysis object");
            std::ostream::operator<<
                      (in_stack_ffffffffffffff68,std::endl<char,std::char_traits<char>>);
            pzinternal::DebugStopImpl(in_stack_00000370,in_stack_00000368);
          }
          TPZAutoPointer<TPZLinearAnalysis>::operator->
                    ((TPZAutoPointer<TPZLinearAnalysis> *)&stack0xffffffffffffffc0);
          TPZAnalysis::StructMatrix(in_stack_ffffffffffffff58);
          in_stack_ffffffffffffff58 =
               (TPZAnalysis *)TPZAutoPointer<TPZStructMatrix>::operator->(&local_60);
          TPZAutoPointer<TPZStructMatrix>::~TPZAutoPointer
                    ((TPZAutoPointer<TPZStructMatrix> *)in_stack_ffffffffffffff50);
          local_58 = in_stack_ffffffffffffff58;
          if (in_stack_ffffffffffffff58 == (TPZAnalysis *)0x0) {
            in_stack_ffffffffffffff50 =
                 std::operator<<((ostream *)&std::cout,
                                 "SetMaterialIds called for substructure without structural matrix")
            ;
            std::ostream::operator<<
                      (in_stack_ffffffffffffff50,std::endl<char,std::char_traits<char>>);
          }
          else {
            SetMaterialIds(in_RSI,materialids_00);
          }
          TPZAutoPointer<TPZLinearAnalysis>::~TPZAutoPointer
                    ((TPZAutoPointer<TPZLinearAnalysis> *)in_stack_ffffffffffffff50);
        }
      }
    }
  }
  return;
}

Assistant:

void TPZStructMatrix::SetMaterialIds(const std::set<int> &materialids)
{
    fMaterialIds = materialids;
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
    {
        std::set<int>::const_iterator it;
        std::stringstream sout;
        sout << "setting input material ids ";
        for(it=materialids.begin(); it!= materialids.end(); it++)
        {
            sout << *it << " ";
        }
        LOGPZ_DEBUG(logger,sout.str())
    }
#endif
    if(!fMesh)
    {
        LOGPZ_ERROR(logger,"SetMaterialIds called without mesh")
        return;
    }
    int64_t iel;
    TPZAdmChunkVector<TPZCompEl*> &elvec = fMesh->ElementVec();
    int64_t nel = elvec.NElements();
    for(iel=0; iel<nel; iel++)
    {
        TPZCompEl *cel = elvec[iel];
        if(!cel) continue;
        TPZSubCompMesh *subcmesh = dynamic_cast<TPZSubCompMesh *> (cel);
        if(!subcmesh) continue;
        TPZAutoPointer<TPZLinearAnalysis> analysis = subcmesh->Analysis();
        if(!analysis)
        {
            LOGPZ_ERROR(logger,"SetMaterialIds called for substructure without analysis object")
            DebugStop();
        }
        TPZStructMatrix *str = analysis->StructMatrix().operator->();
        if(!str)
        {
            LOGPZ_ERROR(logger,"SetMaterialIds called for substructure without structural matrix")
            continue;
        }
        str->SetMaterialIds(materialids);
    }
}